

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_exr(string *filename,uint32_t width,uint32_t height,uint16_t spp,
              vector<float,_std::allocator<float>_> *buffer)

{
  Box *pBVar1;
  pointer pfVar2;
  Channel *pCVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  runtime_error *this;
  undefined8 *puVar7;
  long lVar8;
  Channel local_e0 [16];
  OutputFile exr_out;
  FrameBuffer exr_framebuffer;
  Header exr_header;
  
  _exr_out = 0;
  Imf_2_5::Header::Header((Header *)0x3f800000,0x3f800000,&exr_header);
  pcVar5 = (char *)Imf_2_5::Header::channels();
  exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       exr_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (spp == 1) {
    pBVar1 = (Box *)(buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
    uVar6 = Imf_2_5::Header::dataWindow();
    Imf_2_5::Slice::Make((PixelType)&exr_out,(void *)0x2,pBVar1,uVar6,4,width << 2,1,0.0,true,false)
    ;
    Imf_2_5::Channel::Channel(local_e0,FLOAT,1,1,false);
    Imf_2_5::ChannelList::insert(pcVar5,(Channel *)"Y");
    Imf_2_5::FrameBuffer::insert((char *)&exr_framebuffer,(Slice *)"Y");
  }
  else {
    if (1 < (ushort)(spp - 3)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unsupported number of samples per pixel");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar7 = &DAT_00117c90;
    for (lVar8 = 0; (ulong)spp * 4 != lVar8; lVar8 = lVar8 + 4) {
      pfVar2 = (buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = Imf_2_5::Header::dataWindow();
      Imf_2_5::Slice::Make
                ((PixelType)&exr_out,(void *)0x2,(Box *)((long)pfVar2 + lVar8),uVar6,
                 (ulong)(ushort)(spp * 4),width * (ushort)(spp * 4),1,0.0,true,false);
      pCVar3 = (Channel *)*puVar7;
      Imf_2_5::Channel::Channel(local_e0,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pcVar5,pCVar3);
      Imf_2_5::FrameBuffer::insert((char *)&exr_framebuffer,(Slice *)pCVar3);
      puVar7 = puVar7 + 1;
    }
  }
  pcVar5 = (filename->_M_dataplus)._M_p;
  iVar4 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile(&exr_out,pcVar5,&exr_header,iVar4);
  Imf_2_5::OutputFile::setFrameBuffer((FrameBuffer *)&exr_out);
  Imf_2_5::OutputFile::writePixels((int)&exr_out);
  Imf_2_5::OutputFile::~OutputFile(&exr_out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&exr_framebuffer);
  Imf_2_5::Header::~Header(&exr_header);
  return;
}

Assistant:

void write_exr(
    const std::string& filename,
    uint32_t width, uint32_t height,
    uint16_t spp,
    const std::vector<float>& buffer)
{
    Imf::Header exr_header(width, height);
    Imf::ChannelList &exr_channels = exr_header.channels();
    Imf::FrameBuffer exr_framebuffer;

    if (spp == 1) {
        Imf::Slice slice = Imf::Slice::Make(
            Imf::FLOAT,
            &buffer[0],
            exr_header.dataWindow(),
            sizeof(float), sizeof(float) * width
        );

        exr_channels.insert("Y", Imf::Channel(Imf::FLOAT));
        exr_framebuffer.insert("Y", slice);
    } else if (spp == 3 || spp == 4) {
        const char* layer_names[4] = {"R", "G", "B", "A"};

        for (uint16_t c = 0; c < spp; c++) {
            Imf::Slice slice = Imf::Slice::Make(
                Imf::FLOAT,
                &buffer[c],
                exr_header.dataWindow(),
                spp * sizeof(float), spp * sizeof(float) * width
            );

            exr_channels.insert(layer_names[c], Imf::Channel(Imf::FLOAT));
            exr_framebuffer.insert(layer_names[c], slice);
        }
    } else {
        throw std::runtime_error("unsupported number of samples per pixel");
    }

    Imf::OutputFile exr_out(filename.c_str(), exr_header);
    exr_out.setFrameBuffer(exr_framebuffer);
    exr_out.writePixels(height);
}